

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_ecdsa_sig_recover
              (secp256k1_ecmult_context *ctx,secp256k1_scalar *sigr,secp256k1_scalar *sigs,
              secp256k1_ge *pubkey,secp256k1_scalar *message,int recid)

{
  int iVar1;
  undefined1 local_248 [4];
  int r;
  secp256k1_gej qj;
  secp256k1_scalar u2;
  secp256k1_scalar u1;
  secp256k1_scalar rn;
  secp256k1_gej xj;
  secp256k1_ge x;
  secp256k1_fe fx;
  uchar brx [32];
  int recid_local;
  secp256k1_scalar *message_local;
  secp256k1_ge *pubkey_local;
  secp256k1_scalar *sigs_local;
  secp256k1_scalar *sigr_local;
  secp256k1_ecmult_context *ctx_local;
  
  iVar1 = secp256k1_scalar_is_zero(sigr);
  if ((iVar1 != 0) || (iVar1 = secp256k1_scalar_is_zero(sigs), iVar1 != 0)) {
    return 0;
  }
  secp256k1_scalar_get_b32((uchar *)(fx.n + 4),sigr);
  secp256k1_fe_set_b32((secp256k1_fe *)&x.infinity,(uchar *)(fx.n + 4));
  if ((recid & 2U) != 0) {
    iVar1 = secp256k1_fe_cmp_var((secp256k1_fe *)&x.infinity,&secp256k1_ecdsa_const_p_minus_order);
    if (-1 < iVar1) {
      return 0;
    }
    secp256k1_fe_add((secp256k1_fe *)&x.infinity,&secp256k1_ecdsa_const_order_as_fe);
  }
  iVar1 = secp256k1_ge_set_xo_var
                    ((secp256k1_ge *)&xj.infinity,(secp256k1_fe *)&x.infinity,recid & 1);
  if (iVar1 == 0) {
    return 0;
  }
  secp256k1_gej_set_ge((secp256k1_gej *)(rn.d + 3),(secp256k1_ge *)&xj.infinity);
  secp256k1_scalar_inverse_var((secp256k1_scalar *)(u1.d + 3),sigr);
  secp256k1_scalar_mul((secp256k1_scalar *)(u2.d + 3),(secp256k1_scalar *)(u1.d + 3),message);
  secp256k1_scalar_negate((secp256k1_scalar *)(u2.d + 3),(secp256k1_scalar *)(u2.d + 3));
  secp256k1_scalar_mul((secp256k1_scalar *)&qj.infinity,(secp256k1_scalar *)(u1.d + 3),sigs);
  secp256k1_ecmult(ctx,(secp256k1_gej *)local_248,(secp256k1_gej *)(rn.d + 3),
                   (secp256k1_scalar *)&qj.infinity,(secp256k1_scalar *)(u2.d + 3));
  secp256k1_ge_set_gej_var(pubkey,(secp256k1_gej *)local_248);
  iVar1 = secp256k1_gej_is_infinity((secp256k1_gej *)local_248);
  return (uint)((iVar1 != 0 ^ 0xffU) & 1);
}

Assistant:

static int secp256k1_ecdsa_sig_recover(const secp256k1_ecmult_context *ctx, const secp256k1_scalar *sigr, const secp256k1_scalar* sigs, secp256k1_ge *pubkey, const secp256k1_scalar *message, int recid) {
    unsigned char brx[32];
    secp256k1_fe fx;
    secp256k1_ge x;
    secp256k1_gej xj;
    secp256k1_scalar rn, u1, u2;
    secp256k1_gej qj;
    int r;

    if (secp256k1_scalar_is_zero(sigr) || secp256k1_scalar_is_zero(sigs)) {
        return 0;
    }

    secp256k1_scalar_get_b32(brx, sigr);
    r = secp256k1_fe_set_b32(&fx, brx);
    (void)r;
    VERIFY_CHECK(r); /* brx comes from a scalar, so is less than the order; certainly less than p */
    if (recid & 2) {
        if (secp256k1_fe_cmp_var(&fx, &secp256k1_ecdsa_const_p_minus_order) >= 0) {
            return 0;
        }
        secp256k1_fe_add(&fx, &secp256k1_ecdsa_const_order_as_fe);
    }
    if (!secp256k1_ge_set_xo_var(&x, &fx, recid & 1)) {
        return 0;
    }
    secp256k1_gej_set_ge(&xj, &x);
    secp256k1_scalar_inverse_var(&rn, sigr);
    secp256k1_scalar_mul(&u1, &rn, message);
    secp256k1_scalar_negate(&u1, &u1);
    secp256k1_scalar_mul(&u2, &rn, sigs);
    secp256k1_ecmult(ctx, &qj, &xj, &u2, &u1);
    secp256k1_ge_set_gej_var(pubkey, &qj);
    return !secp256k1_gej_is_infinity(&qj);
}